

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_customMem customMem;
  uint uVar1;
  void *__dest;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  size_t dictID;
  ZSTD_CCtx_params params;
  void *end;
  void *internalBuffer;
  size_t in_stack_ffffffffffffff38;
  undefined8 *dict;
  ZSTD_CCtx_params *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  U32 in_stack_ffffffffffffff58;
  ZSTD_compResetPolicy_e in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  size_t local_8;
  
  dict = &stack0x00000008;
  in_RDI[600] = in_stack_00000008;
  in_RDI[0x259] = in_stack_00000010;
  in_RDI[0x25a] = in_stack_00000018;
  *(undefined4 *)(in_RDI + 0x25b) = (undefined4)dictID;
  if (((in_ECX == 1) || (in_RSI == (void *)0x0)) || (in_RDX == 0)) {
    *in_RDI = 0;
    in_RDI[1] = in_RSI;
  }
  else {
    in_stack_ffffffffffffff38 = in_RDI[0x25e];
    customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffff48;
    customMem.customAlloc = (ZSTD_allocFunction)dict;
    customMem.opaque._0_4_ = in_stack_ffffffffffffff50;
    customMem.opaque._4_4_ = in_stack_ffffffffffffff54;
    __dest = ZSTD_malloc(in_RDI[0x25c],customMem);
    *in_RDI = __dest;
    in_RDI[1] = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,in_RSI,in_RDX);
  }
  in_RDI[2] = in_RDX;
  ZSTD_reset_compressedBlockState((ZSTD_compressedBlockState_t *)(in_RDI + 0x1a));
  ZSTD_reset_matchState
            ((ZSTD_matchState_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (ZSTD_compressionParameters *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
             ,in_stack_ffffffffffffff58);
  memset(&stack0xffffffffffffff50,0,0x78);
  local_8 = ZSTD_compress_insertDictionary
                      ((ZSTD_compressedBlockState_t *)
                       CONCAT44((int)dict[1],(int)((ulong)*dict >> 0x20)),
                       (ZSTD_matchState_t *)CONCAT44((int)*dict,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,dict,in_stack_ffffffffffffff38,
                       (ZSTD_dictContentType_e)((ulong)in_RDI[3] >> 0x20),ZSTD_dtlm_full,
                       (void *)CONCAT44(3,in_stack_ffffffffffffff78));
  uVar1 = ZSTD_isError(0x1f74a4);
  if (uVar1 == 0) {
    *(int *)(in_RDI + 0x25f) = (int)local_8;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (U32)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictBuffer = NULL;
        cdict->dictContent = dictBuffer;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, cdict->customMem);
        cdict->dictBuffer = internalBuffer;
        cdict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    {   void* const end = ZSTD_reset_matchState(
                &cdict->matchState,
                (U32*)cdict->workspace + HUF_WORKSPACE_SIZE_U32,
                &cParams, ZSTDcrp_continue, /* forCCtx */ 0);
        assert(end == (char*)cdict->workspace + cdict->workspaceSize);
        (void)end;
    }
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is <= 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, &params,
                    cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->workspace);
            if (ZSTD_isError(dictID)) return dictID;
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}